

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O3

QString * __thiscall QAction::toolTip(QString *__return_storage_ptr__,QAction *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  Data *pDVar4;
  QArrayData *pQVar5;
  long in_FS_OFFSET;
  QString local_48;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&this->field_0x8;
  lVar3 = *(long *)(lVar2 + 0xd0);
  if (lVar3 == 0) {
    lVar3 = *(long *)(lVar2 + 0x98);
    if (lVar3 == 0) {
      local_48.d.d = *(Data **)(lVar2 + 0xa0);
      local_48.d.ptr = *(char16_t **)(lVar2 + 0xa8);
      local_48.d.size = *(qsizetype *)(lVar2 + 0xb0);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      qt_strippedText(__return_storage_ptr__,&local_48);
      if (&(local_48.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_0058e6a6;
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar1 = ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar5 = &(local_48.d.d)->super_QArrayData;
    }
    else {
      local_30.d.d = *(Data **)(lVar2 + 0x88);
      local_30.d.ptr = *(char16_t **)(lVar2 + 0x90);
      if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_30.d.size = lVar3;
      qt_strippedText(__return_storage_ptr__,&local_30);
      if (&(local_30.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_0058e6a6;
      LOCK();
      ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar1 = ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar5 = &(local_30.d.d)->super_QArrayData;
    }
    if (iVar1 == 0) {
      QArrayData::deallocate(pQVar5,2,0x10);
    }
  }
  else {
    pDVar4 = *(Data **)(lVar2 + 0xc0);
    (__return_storage_ptr__->d).d = pDVar4;
    (__return_storage_ptr__->d).ptr = *(char16_t **)(lVar2 + 200);
    (__return_storage_ptr__->d).size = lVar3;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
LAB_0058e6a6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QAction::toolTip() const
{
    Q_D(const QAction);
    if (d->tooltip.isEmpty()) {
        if (!d->text.isEmpty())
            return qt_strippedText(d->text);
        return qt_strippedText(d->iconText);
    }
    return d->tooltip;
}